

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O0

void DES_encrypt1(uint *data,DES_key_schedule *ks,int enc)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t tt_1;
  uint32_t tt;
  uint32_t u;
  uint32_t t;
  uint32_t r;
  uint32_t l;
  int enc_local;
  DES_key_schedule *ks_local;
  uint32_t *data_local;
  
  uVar5 = (data[1] >> 4 ^ *data) & 0xf0f0f0f;
  uVar1 = uVar5 ^ *data;
  uVar2 = uVar5 << 4 ^ data[1];
  uVar5 = (uVar1 >> 0x10 ^ uVar2) & 0xffff;
  uVar2 = uVar5 ^ uVar2;
  uVar1 = uVar5 << 0x10 ^ uVar1;
  uVar5 = (uVar2 >> 2 ^ uVar1) & 0x33333333;
  uVar1 = uVar5 ^ uVar1;
  uVar2 = uVar5 << 2 ^ uVar2;
  uVar5 = (uVar1 >> 8 ^ uVar2) & 0xff00ff;
  uVar2 = uVar5 ^ uVar2;
  uVar1 = uVar5 << 8 ^ uVar1;
  uVar5 = (uVar2 >> 1 ^ uVar1) & 0x55555555;
  uVar3 = CRYPTO_rotr_u32(uVar5 ^ uVar1,0x1d);
  uVar4 = CRYPTO_rotr_u32(uVar5 << 1 ^ uVar2,0x1d);
  if (enc == 0) {
    uVar5 = uVar3 ^ ks->ks[0xf].deslong[0];
    uVar6 = CRYPTO_rotr_u32(uVar3 ^ *(uint *)((long)ks->ks + 0x7c),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar6 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar6 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar6 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar6 >> 0x1a] ^ uVar4;
    uVar5 = uVar2 ^ ks->ks[0xe].deslong[0];
    uVar4 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x74),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar4 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar4 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar4 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar4 >> 0x1a] ^ uVar3;
    uVar5 = uVar1 ^ ks->ks[0xd].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x6c),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[0xc].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 100),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[0xb].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x5c),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[10].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x54),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[9].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x4c),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[8].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x44),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[7].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x3c),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[6].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x34),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[5].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x2c),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[4].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x24),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[3].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x1c),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[2].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x14),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[1].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0xc),4);
    t = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
        DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
        DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
        DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = t ^ ks->ks[0].deslong[0];
    uVar3 = CRYPTO_rotr_u32(t ^ ks->ks[0].deslong[1],4);
    u = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
        DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
        DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
        DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
  }
  else {
    uVar5 = uVar3 ^ ks->ks[0].deslong[0];
    uVar6 = CRYPTO_rotr_u32(uVar3 ^ ks->ks[0].deslong[1],4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar6 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar6 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar6 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar6 >> 0x1a] ^ uVar4;
    uVar5 = uVar2 ^ ks->ks[1].deslong[0];
    uVar4 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0xc),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar4 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar4 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar4 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar4 >> 0x1a] ^ uVar3;
    uVar5 = uVar1 ^ ks->ks[2].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x14),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[3].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x1c),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[4].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x24),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[5].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x2c),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[6].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x34),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[7].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x3c),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[8].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x44),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[9].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x4c),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[10].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x54),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[0xb].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x5c),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[0xc].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 100),4);
    uVar2 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = uVar2 ^ ks->ks[0xd].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar2 ^ *(uint *)((long)ks->ks + 0x6c),4);
    uVar1 = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
            DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
            DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
            DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
    uVar5 = uVar1 ^ ks->ks[0xe].deslong[0];
    uVar3 = CRYPTO_rotr_u32(uVar1 ^ *(uint *)((long)ks->ks + 0x74),4);
    t = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
        DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
        DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
        DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar2;
    uVar5 = t ^ ks->ks[0xf].deslong[0];
    uVar3 = CRYPTO_rotr_u32(t ^ *(uint *)((long)ks->ks + 0x7c),4);
    u = DES_SPtrans[0][uVar5 >> 2 & 0x3f] ^ DES_SPtrans[2][uVar5 >> 10 & 0x3f] ^
        DES_SPtrans[4][uVar5 >> 0x12 & 0x3f] ^ DES_SPtrans[6][uVar5 >> 0x1a] ^
        DES_SPtrans[1][uVar3 >> 2 & 0x3f] ^ DES_SPtrans[3][uVar3 >> 10 & 0x3f] ^
        DES_SPtrans[5][uVar3 >> 0x12 & 0x3f] ^ DES_SPtrans[7][uVar3 >> 0x1a] ^ uVar1;
  }
  uVar3 = CRYPTO_rotr_u32(t,3);
  uVar4 = CRYPTO_rotr_u32(u,3);
  uVar5 = (uVar4 >> 1 ^ uVar3) & 0x55555555;
  uVar1 = uVar5 ^ uVar3;
  uVar2 = uVar5 << 1 ^ uVar4;
  uVar5 = (uVar1 >> 8 ^ uVar2) & 0xff00ff;
  uVar2 = uVar5 ^ uVar2;
  uVar1 = uVar5 << 8 ^ uVar1;
  uVar5 = (uVar2 >> 2 ^ uVar1) & 0x33333333;
  uVar1 = uVar5 ^ uVar1;
  uVar2 = uVar5 << 2 ^ uVar2;
  uVar5 = (uVar1 >> 0x10 ^ uVar2) & 0xffff;
  uVar2 = uVar5 ^ uVar2;
  uVar1 = uVar5 << 0x10 ^ uVar1;
  uVar5 = (uVar2 >> 4 ^ uVar1) & 0xf0f0f0f;
  *data = uVar5 ^ uVar1;
  data[1] = uVar5 << 4 ^ uVar2;
  return;
}

Assistant:

static void DES_encrypt1(uint32_t data[2], const DES_key_schedule *ks,
                         int enc) {
  uint32_t l, r, t, u;

  r = data[0];
  l = data[1];

  IP(r, l);
  // Things have been modified so that the initial rotate is done outside
  // the loop.  This required the DES_SPtrans values in sp.h to be
  // rotated 1 bit to the right. One perl script later and things have a
  // 5% speed up on a sparc2. Thanks to Richard Outerbridge
  // <71755.204@CompuServe.COM> for pointing this out.
  // clear the top bits on machines with 8byte longs
  // shift left by 2
  r = CRYPTO_rotr_u32(r, 29);
  l = CRYPTO_rotr_u32(l, 29);

  // I don't know if it is worth the effort of loop unrolling the
  // inner loop
  if (enc) {
    D_ENCRYPT(ks, l, r, 0);
    D_ENCRYPT(ks, r, l, 1);
    D_ENCRYPT(ks, l, r, 2);
    D_ENCRYPT(ks, r, l, 3);
    D_ENCRYPT(ks, l, r, 4);
    D_ENCRYPT(ks, r, l, 5);
    D_ENCRYPT(ks, l, r, 6);
    D_ENCRYPT(ks, r, l, 7);
    D_ENCRYPT(ks, l, r, 8);
    D_ENCRYPT(ks, r, l, 9);
    D_ENCRYPT(ks, l, r, 10);
    D_ENCRYPT(ks, r, l, 11);
    D_ENCRYPT(ks, l, r, 12);
    D_ENCRYPT(ks, r, l, 13);
    D_ENCRYPT(ks, l, r, 14);
    D_ENCRYPT(ks, r, l, 15);
  } else {
    D_ENCRYPT(ks, l, r, 15);
    D_ENCRYPT(ks, r, l, 14);
    D_ENCRYPT(ks, l, r, 13);
    D_ENCRYPT(ks, r, l, 12);
    D_ENCRYPT(ks, l, r, 11);
    D_ENCRYPT(ks, r, l, 10);
    D_ENCRYPT(ks, l, r, 9);
    D_ENCRYPT(ks, r, l, 8);
    D_ENCRYPT(ks, l, r, 7);
    D_ENCRYPT(ks, r, l, 6);
    D_ENCRYPT(ks, l, r, 5);
    D_ENCRYPT(ks, r, l, 4);
    D_ENCRYPT(ks, l, r, 3);
    D_ENCRYPT(ks, r, l, 2);
    D_ENCRYPT(ks, l, r, 1);
    D_ENCRYPT(ks, r, l, 0);
  }

  // rotate and clear the top bits on machines with 8byte longs
  l = CRYPTO_rotr_u32(l, 3);
  r = CRYPTO_rotr_u32(r, 3);

  FP(r, l);
  data[0] = l;
  data[1] = r;
}